

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void anon_unknown.dwarf_4d26f::Dilate
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,uint32_t dilationX
               ,uint32_t dilationY,uint8_t value)

{
  uint8_t *puVar1;
  uint uVar2;
  long lVar3;
  uint32_t i_1;
  uint uVar4;
  void *pvVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  byte *pbVar11;
  ulong uVar12;
  long lVar13;
  uint8_t *puVar14;
  ulong uVar15;
  byte *pbVar16;
  long lVar17;
  byte *pbVar18;
  byte *pbVar19;
  ulong uVar20;
  int iVar21;
  byte *local_88;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar9 = width >> 1;
  if (dilationX <= width >> 1) {
    uVar9 = dilationX;
  }
  uVar2 = height >> 1;
  if (dilationY <= height >> 1) {
    uVar2 = dilationY;
  }
  uVar8 = (ulong)width;
  if (uVar9 != 0) {
    pvVar5 = operator_new__((ulong)(width * 2) << 3);
    uVar4 = image->_rowSize;
    uVar15 = (ulong)uVar4;
    pbVar18 = image->_data + (ulong)(uVar4 * y) + (ulong)x;
    uVar7 = (ulong)uVar9;
    pbVar16 = pbVar18 + uVar4 * height;
    local_88 = pbVar18 + uVar8;
    lVar17 = -(long)pbVar18;
    for (; pbVar18 != pbVar16; pbVar18 = pbVar18 + uVar15) {
      bVar10 = *pbVar18;
      pbVar19 = pbVar18;
      uVar20 = 0;
LAB_0010d4cd:
      lVar13 = 0;
      while( true ) {
        lVar3 = lVar13 + 1;
        if (pbVar19 + lVar3 == pbVar18 + uVar8) break;
        lVar13 = lVar13 + 1;
        if (pbVar19[lVar3] != bVar10) goto code_r0x0010d4e4;
      }
      for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
        puVar1 = *(uint8_t **)((long)pvVar5 + uVar12 * 8 + uVar8 * 8);
        for (puVar14 = *(uint8_t **)((long)pvVar5 + uVar12 * 8); puVar14 != puVar1;
            puVar14 = puVar14 + 1) {
          *puVar14 = value;
        }
      }
      local_88 = local_88 + uVar15;
      lVar17 = lVar17 - uVar15;
    }
    operator_delete__(pvVar5);
  }
  if (uVar2 == 0) {
    return;
  }
  pvVar5 = operator_new__((ulong)(height * 2) << 3);
  uVar9 = image->_rowSize;
  pbVar18 = image->_data + (ulong)(y * uVar9) + (ulong)x;
  pbVar16 = pbVar18 + uVar8;
  iVar21 = -(x + (int)image->_data + y * uVar9);
  do {
    if (pbVar18 == pbVar16) {
      operator_delete__(pvVar5);
      return;
    }
    bVar10 = *pbVar18;
    uVar8 = 0;
    pbVar19 = pbVar18;
LAB_0010d5fd:
    uVar4 = iVar21 + (int)pbVar19;
    while( true ) {
      pbVar19 = pbVar19 + uVar9;
      if (pbVar19 == pbVar18 + uVar9 * height) break;
      uVar4 = uVar4 + uVar9;
      if (*pbVar19 != bVar10) goto code_r0x0010d614;
    }
    for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
      puVar1 = *(uint8_t **)((long)pvVar5 + uVar7 * 8 + (ulong)height * 8);
      for (puVar14 = *(uint8_t **)((long)pvVar5 + uVar7 * 8); puVar14 != puVar1;
          puVar14 = puVar14 + uVar9) {
        *puVar14 = value;
      }
    }
    pbVar18 = pbVar18 + 1;
    iVar21 = iVar21 + -1;
  } while( true );
code_r0x0010d614:
  bVar10 = ~bVar10;
  pbVar6 = pbVar19 + -(ulong)(uVar9 * uVar2);
  if (uVar4 / uVar9 < uVar2) {
    pbVar6 = pbVar18;
  }
  *(byte **)((long)pvVar5 + uVar8 * 8) = pbVar6;
  pbVar6 = pbVar19 + uVar9 * uVar2;
  if (height - uVar4 / uVar9 < uVar2) {
    pbVar6 = pbVar18 + uVar9 * height;
  }
  *(byte **)((long)pvVar5 + uVar8 * 8 + (ulong)height * 8) = pbVar6;
  uVar8 = (ulong)((int)uVar8 + 1);
  goto LAB_0010d5fd;
code_r0x0010d4e4:
  pbVar6 = pbVar19 + lVar13;
  bVar10 = ~bVar10;
  pbVar11 = pbVar6 + -uVar7;
  if ((long)(pbVar6 + lVar17) < (long)uVar7) {
    pbVar11 = pbVar18;
  }
  *(byte **)((long)pvVar5 + uVar20 * 8) = pbVar11;
  pbVar11 = pbVar6 + uVar7;
  if ((long)(local_88 + (-lVar13 - (long)pbVar19)) < (long)uVar7) {
    pbVar11 = pbVar18 + uVar8;
  }
  *(byte **)((long)pvVar5 + uVar20 * 8 + uVar8 * 8) = pbVar11;
  pbVar19 = pbVar6;
  uVar20 = (ulong)((int)uVar20 + 1);
  goto LAB_0010d4cd;
}

Assistant:

void Dilate( PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, uint32_t dilationX, uint32_t dilationY, uint8_t value )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );


        if( dilationX > width / 2 )
            dilationX = width / 2;
        if( dilationY > height / 2 )
            dilationY = height / 2;

        if( dilationX > 0u ) {
            const int32_t dilateX = static_cast<int32_t>(dilationX);

            uint8_t ** startPos = new uint8_t *[2 * width];
            uint8_t ** endPos = startPos + width;

            const uint32_t rowSize = image.rowSize();
            uint8_t * imageY    = image.data() + y * rowSize + x;
            uint8_t * imageYEnd = imageY + height * rowSize;

            for( ; imageY != imageYEnd; imageY += rowSize ) {
                uint32_t pairCount = 0u;

                uint8_t previousValue = *imageY;

                uint8_t * imageXStart = imageY;
                uint8_t * imageX      = imageXStart + 1;
                uint8_t * imageXEnd   = imageXStart + width;

                for( ; imageX != imageXEnd; ++imageX ) {
                    if( (*imageX) != previousValue ) {
                        if( imageX - imageXStart < dilateX )
                            startPos[pairCount] = imageXStart;
                        else
                            startPos[pairCount] = imageX - dilateX;

                        if( imageXEnd - imageX < dilateX )
                            endPos[pairCount] = imageXEnd;
                        else
                            endPos[pairCount] = imageX + dilateX;

                        previousValue = 0xFFu ^ previousValue;
                        ++pairCount;
                    }
                }

                for( uint32_t i = 0u; i < pairCount; ++i ) {
                    imageX    = startPos[i];
                    imageXEnd = endPos[i];

                    for( ; imageX != imageXEnd; ++imageX )
                        (*imageX) = value;
                }
            }

            delete[] startPos;
        }

        if( dilationY > 0u ) {
            uint8_t ** startPos = new uint8_t *[2 * height];
            uint8_t ** endPos = startPos + height;

            const uint32_t rowSize = image.rowSize();
            uint8_t * imageX    = image.data() + y * rowSize + x;
            uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX ) {
                uint32_t pairCount = 0u;

                uint8_t previousValue = *imageX;

                uint8_t * imageYStart = imageX;
                uint8_t * imageY      = imageYStart + rowSize;
                uint8_t * imageYEnd   = imageYStart + height * rowSize;

                for( ; imageY != imageYEnd; imageY += rowSize ) {
                    if( (*imageY) != previousValue ) {
                        const uint32_t rowId = static_cast<uint32_t>(imageY - imageYStart) / rowSize;

                        if( rowId < dilationY )
                            startPos[pairCount] = imageYStart;
                        else
                            startPos[pairCount] = imageY - dilationY * rowSize;

                        if( height - rowId < dilationY )
                            endPos[pairCount] = imageYEnd;
                        else
                            endPos[pairCount] = imageY + dilationY * rowSize;

                        previousValue = 0xFFu ^ previousValue;
                        ++pairCount;
                    }
                }

                for( uint32_t i = 0u; i < pairCount; ++i ) {
                    imageY    = startPos[i];
                    imageYEnd = endPos[i];

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*imageY) = value;
                }
            }

            delete[] startPos;
        }
    }